

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::InstanceArray>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::InstanceArray> *recalculatePrimRef)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  InstanceArray *pIVar2;
  float *pfVar3;
  size_t i;
  float fVar4;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 in_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined4 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  LBBox3fa bn0;
  BBox1f local_e0;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_a8 = time_range.upper;
  uStack_b0 = (int)in_XMM0_Qb;
  local_b8 = time_range;
  uStack_ac = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_d8 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar11 = (set->super_PrimInfoMB).max_time_range.upper - local_d8;
  local_c8 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fStack_a4 = local_a8;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  fVar4 = roundf((((time_range.lower * 0.5 + local_a8 * 0.5) - local_d8) / fVar11) * local_c8);
  uVar7 = extraout_var._0_4_;
  uVar8 = extraout_var._4_4_;
  uVar9 = extraout_var._8_4_;
  fVar4 = (fVar4 / local_c8) * fVar11 + local_d8;
  if (((float)local_b8._0_4_ < fVar4) && (fVar4 < local_a8)) {
    local_48 = (float)local_b8._0_4_;
    uStack_40 = uStack_b0;
    uStack_3c = uStack_ac;
    fStack_54 = (float)local_b8._4_4_;
    uStack_50 = uStack_b0;
    uStack_4c = uStack_ac;
    pfVar3 = &prims[begin].time_range.upper;
    local_d8 = fVar4;
    uStack_d4 = uVar7;
    uStack_d0 = uVar8;
    uStack_cc = uVar9;
    local_58 = fVar4;
    fStack_44 = fVar4;
    for (; begin < end; begin = begin + 1) {
      fVar11 = *pfVar3 * 0.9999;
      if (((float)local_b8._0_4_ < fVar11) && (((BBox1f *)(pfVar3 + -1))->lower * 1.0001 < fVar4)) {
        local_e0.upper = fStack_44;
        local_e0.lower = local_48;
        aVar5.m128[2] = (float)uStack_40;
        aVar5._0_4_ = local_48;
        aVar5._4_4_ = fStack_44;
        aVar5.m128[3] = (float)uStack_3c;
        pIVar2 = (InstanceArray *)
                 (recalculatePrimRef->scene->geometries).items[(uint)pfVar3[-0xe]].ptr;
        if ((*(long *)&(pIVar2->super_Geometry).field_0x58 != 0) ||
           (*(int *)((pIVar2->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar2->object_ids).super_RawBufferView.stride * (ulong)(uint)pfVar3[-10]) !=
            -1)) {
          InstanceArray::nonlinearBounds
                    ((LBBox3fa *)&local_98.field_1,pIVar2,(ulong)(uint)pfVar3[-10],&local_e0,
                     &(pIVar2->super_Geometry).time_range,(pIVar2->super_Geometry).fnumTimeSegments)
          ;
          aVar5 = local_98;
          fVar4 = local_d8;
          uVar7 = uStack_d4;
          uVar8 = uStack_d0;
          uVar9 = uStack_cc;
        }
        aVar10.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,aVar5.m128);
        aVar5 = this->bounds0[0].bounds0.upper.field_0;
        aVar6 = this->bounds0[0].bounds1.lower.field_0;
        aVar1 = this->bounds0[0].bounds1.upper.field_0;
        this->bounds0[0].bounds0.lower.field_0 = aVar10;
        aVar5.m128 = (__m128)maxps(aVar5.m128,local_88);
        this->bounds0[0].bounds0.upper.field_0 = aVar5;
        aVar5.m128 = (__m128)minps(aVar6.m128,local_78);
        this->bounds0[0].bounds1.lower.field_0 = aVar5;
        aVar5.m128 = (__m128)maxps(aVar1.m128,local_68);
        this->bounds0[0].bounds1.upper.field_0 = aVar5;
        fVar13 = (float)(uint)pfVar3[-2];
        fVar11 = (*(BBox1f *)(pfVar3 + -1)).lower;
        fVar12 = (*(BBox1f *)(pfVar3 + -1)).upper - fVar11;
        local_c8 = (fVar4 - fVar11) / fVar12;
        uStack_c4 = uVar7;
        uStack_c0 = uVar8;
        uStack_bc = uVar9;
        fVar11 = floorf((((float)local_b8._0_4_ - fVar11) / fVar12) * 1.0000002 * fVar13);
        fVar4 = 0.0;
        if (0.0 <= fVar11) {
          fVar4 = fVar11;
        }
        fVar11 = ceilf(local_c8 * 0.99999976 * fVar13);
        if (fVar13 <= fVar11) {
          fVar11 = fVar13;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar11 - (int)fVar4);
        fVar11 = *pfVar3 * 0.9999;
        fVar4 = local_d8;
        uVar7 = uStack_d4;
        uVar8 = uStack_d0;
        uVar9 = uStack_cc;
      }
      if ((fVar4 < fVar11) && (((BBox1f *)(pfVar3 + -1))->lower * 1.0001 < local_a8)) {
        local_e0.upper = fStack_54;
        local_e0.lower = local_58;
        aVar6.m128[2] = (float)uStack_50;
        aVar6._0_4_ = local_58;
        aVar6._4_4_ = fStack_54;
        aVar6.m128[3] = (float)uStack_4c;
        pIVar2 = (InstanceArray *)
                 (recalculatePrimRef->scene->geometries).items[(uint)pfVar3[-0xe]].ptr;
        if ((*(long *)&(pIVar2->super_Geometry).field_0x58 != 0) ||
           (*(int *)((pIVar2->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar2->object_ids).super_RawBufferView.stride * (ulong)(uint)pfVar3[-10]) !=
            -1)) {
          InstanceArray::nonlinearBounds
                    ((LBBox3fa *)&local_98.field_1,pIVar2,(ulong)(uint)pfVar3[-10],&local_e0,
                     &(pIVar2->super_Geometry).time_range,(pIVar2->super_Geometry).fnumTimeSegments)
          ;
          aVar6 = local_98;
          fVar4 = local_d8;
        }
        aVar10.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,aVar6.m128);
        aVar5 = this->bounds1[0].bounds0.upper.field_0;
        aVar6 = this->bounds1[0].bounds1.lower.field_0;
        aVar1 = this->bounds1[0].bounds1.upper.field_0;
        this->bounds1[0].bounds0.lower.field_0 = aVar10;
        aVar5.m128 = (__m128)maxps(aVar5.m128,local_88);
        this->bounds1[0].bounds0.upper.field_0 = aVar5;
        aVar5.m128 = (__m128)minps(aVar6.m128,local_78);
        this->bounds1[0].bounds1.lower.field_0 = aVar5;
        aVar5.m128 = (__m128)maxps(aVar1.m128,local_68);
        this->bounds1[0].bounds1.upper.field_0 = aVar5;
        fVar13 = (float)(uint)pfVar3[-2];
        fVar11 = (*(BBox1f *)(pfVar3 + -1)).lower;
        fVar12 = (*(BBox1f *)(pfVar3 + -1)).upper - fVar11;
        local_c8 = (local_a8 - fVar11) / fVar12;
        fVar11 = floorf(((fVar4 - fVar11) / fVar12) * 1.0000002 * fVar13);
        fVar4 = 0.0;
        if (0.0 <= fVar11) {
          fVar4 = fVar11;
        }
        fVar11 = ceilf(local_c8 * 0.99999976 * fVar13);
        if (fVar13 <= fVar11) {
          fVar11 = fVar13;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar11 - (int)fVar4);
        fVar4 = local_d8;
        uVar7 = uStack_d4;
        uVar8 = uStack_d0;
        uVar9 = uStack_cc;
      }
      pfVar3 = pfVar3 + 0x14;
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }